

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

bool __thiscall chrono::ChBody::TrySleeping(ChBody *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar2 = this->bflags;
  this->bflags = uVar2 & 0xffffefff;
  if ((uVar2 >> 10 & 1) == 0) {
    return false;
  }
  iVar3 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
    auVar5 = vandpd_avx(auVar5,auVar4);
    auVar7 = vandpd_avx(auVar7,auVar4);
    auVar9 = vandpd_avx(auVar9,auVar4);
    auVar5 = vmaxsd_avx(auVar7,auVar5);
    auVar5 = vmaxsd_avx(auVar9,auVar5);
    if (auVar5._0_8_ < (double)this->sleep_minspeed) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
      auVar5 = vandpd_avx(auVar6,auVar4);
      auVar7 = vandpd_avx(auVar8,auVar4);
      auVar7 = vmaxsd_avx(auVar7,auVar5);
      auVar5 = vandpd_avx(auVar10,auVar4);
      auVar7 = vmaxsd_avx(auVar5,auVar7);
      auVar5 = vandpd_avx(auVar11,auVar4);
      auVar5 = vmaxsd_avx(auVar5,auVar7);
      if (auVar5._0_8_ + auVar5._0_8_ < (double)this->sleep_minwvel) {
        if ((this->super_ChPhysicsItem).super_ChObj.ChTime - (double)this->sleep_starttime <=
            (double)this->sleep_time) {
          return false;
        }
        pbVar1 = (byte *)((long)&this->bflags + 1);
        *pbVar1 = *pbVar1 | 0x10;
        return true;
      }
    }
    this->sleep_starttime = (float)(this->super_ChPhysicsItem).super_ChObj.ChTime;
  }
  return false;
}

Assistant:

void ChBody::BFlagSet(BodyFlag mask, bool state) {
    if (state)
        bflags |= mask;
    else
        bflags &= ~mask;
}